

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::AddGlyph(ImFont *this,ImWchar codepoint,float x0,float y0,float x1,float y1,float u0,
                float v0,float u1,float v1,float advance_x)

{
  int iVar1;
  int iVar2;
  ImFontGlyph *pIVar3;
  ImFontConfig *pIVar4;
  ImFontGlyph *__dest;
  int iVar5;
  int iVar6;
  float fVar7;
  
  iVar1 = (this->Glyphs).Size;
  iVar6 = iVar1 + 1;
  iVar2 = (this->Glyphs).Capacity;
  if (iVar2 <= iVar1) {
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar5 <= iVar6) {
      iVar5 = iVar6;
    }
    if (iVar2 < iVar5) {
      __dest = (ImFontGlyph *)ImGui::MemAlloc((long)iVar5 * 0x28);
      pIVar3 = (this->Glyphs).Data;
      if (pIVar3 != (ImFontGlyph *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->Glyphs).Size * 0x28);
        ImGui::MemFree((this->Glyphs).Data);
      }
      (this->Glyphs).Data = __dest;
      (this->Glyphs).Capacity = iVar5;
    }
  }
  (this->Glyphs).Size = iVar6;
  pIVar3 = (this->Glyphs).Data;
  pIVar3[iVar1].Codepoint = codepoint;
  pIVar3[iVar1].X0 = x0;
  pIVar3[iVar1].Y0 = y0;
  pIVar3[iVar1].X1 = x1;
  pIVar3[iVar1].Y1 = y1;
  pIVar3[iVar1].U0 = u0;
  pIVar3[iVar1].V0 = v0;
  pIVar3[iVar1].U1 = u1;
  pIVar3[iVar1].V1 = v1;
  pIVar4 = this->ConfigData;
  fVar7 = advance_x + (pIVar4->GlyphExtraSpacing).x;
  pIVar3[iVar1].AdvanceX = fVar7;
  if (pIVar4->PixelSnapH == true) {
    pIVar3[iVar1].AdvanceX = (float)(int)(fVar7 + 0.5);
  }
  this->DirtyLookupTables = true;
  this->MetricsTotalSurface =
       this->MetricsTotalSurface +
       (int)((float)this->ContainerAtlas->TexHeight * (v1 - v0) + 1.99) *
       (int)((float)this->ContainerAtlas->TexWidth * (u1 - u0) + 1.99);
  return;
}

Assistant:

void ImFont::AddGlyph(ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (ImWchar)codepoint;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x + ConfigData->GlyphExtraSpacing.x;  // Bake spacing into AdvanceX

    if (ConfigData->PixelSnapH)
        glyph.AdvanceX = (float)(int)(glyph.AdvanceX + 0.5f);

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + 1.99f) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + 1.99f);
}